

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

MB_MODE_INFO *
get_winner_mode_stats
          (MACROBLOCK *x,MB_MODE_INFO *best_mbmode,RD_STATS *best_rd_cost,int best_rate_y,
          int best_rate_uv,THR_MODES *best_mode_index,RD_STATS **winner_rd_cost,int *winner_rate_y,
          int *winner_rate_uv,THR_MODES *winner_mode_index,
          MULTI_WINNER_MODE_TYPE multi_winner_mode_type,int mode_idx)

{
  WinnerModeStats *winner_mode_stat;
  MB_MODE_INFO *winner_mbmi;
  THR_MODES *best_mode_index_local;
  int best_rate_uv_local;
  int best_rate_y_local;
  RD_STATS *best_rd_cost_local;
  MB_MODE_INFO *best_mbmode_local;
  MACROBLOCK *x_local;
  
  if (multi_winner_mode_type == '\0') {
    *winner_rd_cost = best_rd_cost;
    *winner_rate_y = best_rate_y;
    *winner_rate_uv = best_rate_uv;
    *winner_mode_index = *best_mode_index;
    winner_mbmi = best_mbmode;
  }
  else {
    winner_mbmi = &x->winner_mode_stats[mode_idx].mbmi;
    *winner_rd_cost = &((WinnerModeStats *)winner_mbmi)->rd_cost;
    *winner_rate_y = ((WinnerModeStats *)winner_mbmi)->rate_y;
    *winner_rate_uv = ((WinnerModeStats *)winner_mbmi)->rate_uv;
    *winner_mode_index = ((WinnerModeStats *)winner_mbmi)->mode_index;
  }
  return winner_mbmi;
}

Assistant:

static inline MB_MODE_INFO *get_winner_mode_stats(
    MACROBLOCK *x, MB_MODE_INFO *best_mbmode, RD_STATS *best_rd_cost,
    int best_rate_y, int best_rate_uv, THR_MODES *best_mode_index,
    RD_STATS **winner_rd_cost, int *winner_rate_y, int *winner_rate_uv,
    THR_MODES *winner_mode_index, MULTI_WINNER_MODE_TYPE multi_winner_mode_type,
    int mode_idx) {
  MB_MODE_INFO *winner_mbmi;
  if (multi_winner_mode_type) {
    assert(mode_idx >= 0 && mode_idx < x->winner_mode_count);
    WinnerModeStats *winner_mode_stat = &x->winner_mode_stats[mode_idx];
    winner_mbmi = &winner_mode_stat->mbmi;

    *winner_rd_cost = &winner_mode_stat->rd_cost;
    *winner_rate_y = winner_mode_stat->rate_y;
    *winner_rate_uv = winner_mode_stat->rate_uv;
    *winner_mode_index = winner_mode_stat->mode_index;
  } else {
    winner_mbmi = best_mbmode;
    *winner_rd_cost = best_rd_cost;
    *winner_rate_y = best_rate_y;
    *winner_rate_uv = best_rate_uv;
    *winner_mode_index = *best_mode_index;
  }
  return winner_mbmi;
}